

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_list.cpp
# Opt level: O3

PGList * duckdb_libpgquery::list_copy(PGList *oldlist)

{
  PGNodeTag PVar1;
  PGListCell *pPVar2;
  PGListCell *pPVar3;
  PGList *pPVar4;
  PGListCell *pPVar5;
  
  if (oldlist == (PGList *)0x0) {
    pPVar4 = (PGList *)0x0;
  }
  else {
    PVar1 = oldlist->type;
    pPVar3 = (PGListCell *)palloc(0x10);
    pPVar3->next = (PGListCell *)0x0;
    pPVar4 = (PGList *)palloc(0x18);
    pPVar4->type = PVar1;
    pPVar4->length = 1;
    pPVar4->head = pPVar3;
    pPVar4->tail = pPVar3;
    pPVar4->length = oldlist->length;
    pPVar3->data = oldlist->head->data;
    pPVar2 = pPVar4->head;
    for (pPVar3 = oldlist->head->next; pPVar3 != (PGListCell *)0x0; pPVar3 = pPVar3->next) {
      pPVar5 = (PGListCell *)palloc(0x10);
      pPVar5->data = pPVar3->data;
      pPVar2->next = pPVar5;
      pPVar2 = pPVar5;
    }
    pPVar2->next = (PGListCell *)0x0;
    pPVar4->tail = pPVar2;
  }
  return pPVar4;
}

Assistant:

PGList *
list_copy(const PGList *oldlist)
{
	PGList	   *newlist;
	PGListCell   *newlist_prev;
	PGListCell   *oldlist_cur;

	if (oldlist == NIL)
		return NIL;

	newlist = new_list(oldlist->type);
	newlist->length = oldlist->length;

	/*
	 * Copy over the data in the first cell; new_list() has already allocated
	 * the head cell itself
	 */
	newlist->head->data = oldlist->head->data;

	newlist_prev = newlist->head;
	oldlist_cur = oldlist->head->next;
	while (oldlist_cur)
	{
		PGListCell   *newlist_cur;

		newlist_cur = (PGListCell *) palloc(sizeof(*newlist_cur));
		newlist_cur->data = oldlist_cur->data;
		newlist_prev->next = newlist_cur;

		newlist_prev = newlist_cur;
		oldlist_cur = oldlist_cur->next;
	}

	newlist_prev->next = NULL;
	newlist->tail = newlist_prev;

	check_list_invariants(newlist);
	return newlist;
}